

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O0

QColor __thiscall QFusionStylePrivate::tabFrameColor(QFusionStylePrivate *this,QPalette *pal)

{
  BrushStyle BVar1;
  QPalette *in_RSI;
  QFusionStylePrivate *in_RDI;
  long in_FS_OFFSET;
  QColor QVar2;
  undefined1 auVar3 [16];
  undefined8 in_stack_ffffffffffffffb8;
  QColor *in_stack_ffffffffffffffc0;
  undefined6 local_28;
  undefined2 local_22;
  undefined6 uStack_20;
  undefined8 local_18;
  undefined4 local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPalette::window((QPalette *)0x4f88c4);
  BVar1 = QBrush::style((QBrush *)0x4f88cc);
  if (BVar1 == TexturePattern) {
    QColor::QColor(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (int)in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  else {
    QVar2 = buttonColor(in_RDI,in_RSI);
    uStack_20 = QVar2.ct._4_6_;
    local_28 = QVar2._0_6_;
    local_22 = QVar2.ct._2_2_;
    auVar3 = QColor::lighter((int)&local_28);
    local_18 = auVar3._0_8_;
    local_10 = auVar3._8_4_;
    uStack_c = auVar3._12_2_;
  }
  QVar2.ct.argb.pad = uStack_c;
  QVar2.ct._4_4_ = local_10;
  QVar2._14_2_ = uStack_a;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor tabFrameColor(const QPalette &pal) const {
        if (pal.window().style() == Qt::TexturePattern)
            return QColor(255, 255, 255, 8);
        return buttonColor(pal).lighter(104);
    }